

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helicsWebServer.hpp
# Opt level: O2

void __thiscall helics::apps::WebServer::WebServer(WebServer *this,string_view server_name)

{
  allocator<char> local_21;
  basic_string_view<char,_std::char_traits<char>_> local_20;
  
  local_20._M_str = server_name._M_str;
  local_20._M_len = server_name._M_len;
  (this->super_TypedBrokerServer)._vptr_TypedBrokerServer = (_func_int **)&PTR__WebServer_004c0b60;
  (this->running)._M_base._M_i = false;
  (this->context).super___shared_ptr<helics::apps::IocWrapper,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->context).super___shared_ptr<helics::apps::IocWrapper,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->mainLoopThread)._M_id._M_thread = 0;
  (this->threadGuard).super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->threadGuard).super___mutex_base._M_mutex + 8) = 0;
  *(undefined8 *)((long)&(this->threadGuard).super___mutex_base._M_mutex + 0x10) = 0;
  (this->threadGuard).super___mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)0x0;
  (this->threadGuard).super___mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)0x0;
  this->config = (json *)0x0;
  std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
            ((string *)&this->mName,&local_20,&local_21);
  (this->mArgs)._M_dataplus._M_p = (pointer)&(this->mArgs).field_2;
  (this->mArgs)._M_string_length = 0;
  (this->mArgs).field_2._M_local_buf[0] = '\0';
  (this->mHttpAddress)._M_dataplus._M_p = (pointer)&(this->mHttpAddress).field_2;
  (this->mHttpAddress)._M_string_length = 0;
  (this->mHttpAddress).field_2._M_local_buf[0] = '\0';
  this->mHttpPort = 0xaa16;
  (this->mWebsocketAddress)._M_dataplus._M_p = (pointer)&(this->mWebsocketAddress).field_2;
  (this->mWebsocketAddress)._M_string_length = 0;
  (this->mWebsocketAddress).field_2._M_local_buf[0] = '\0';
  this->mWebsocketPort = 0xaa17;
  this->mHttpEnabled = false;
  this->mWebsocketEnabled = false;
  this->mInterfaceNetwork = 0;
  (this->executing)._M_base._M_i = false;
  return;
}

Assistant:

explicit WebServer(std::string_view server_name): mName(server_name) {}